

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void quoteFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  uchar *puVar4;
  double dVar5;
  char *z;
  uchar *zArg;
  u64 n;
  int j;
  int i_1;
  int i;
  int nBlob;
  char *zBlob;
  char *zText;
  char zBuf [50];
  double r2;
  double r1;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  iVar1 = sqlite3_value_type(*argv);
  if (iVar1 - 1U < 3 || iVar1 == 4) {
    switch((long)&switchD_001ea35b::switchdataD_001f214c +
           (long)(int)(&switchD_001ea35b::switchdataD_001f214c)[iVar1 - 1U]) {
    case 0x1ea35d:
      dVar5 = sqlite3_value_double(*argv);
      sqlite3_snprintf(0x32,(char *)&zText,"%!.15g",dVar5);
      sqlite3AtoF((char *)&zText,(double *)(zBuf + 0x30),0x14,'\x01');
      if ((dVar5 != stack0xffffffffffffffd0) || (NAN(dVar5) || NAN(stack0xffffffffffffffd0))) {
        sqlite3_snprintf(0x32,(char *)&zText,"%!.20e",dVar5);
      }
      sqlite3_result_text(context,(char *)&zText,-1,(_func_void_void_ptr *)0xffffffffffffffff);
      break;
    case 0x1ea3eb:
      sqlite3_result_value(context,*argv);
      break;
    case 0x1ea400:
      pvVar2 = sqlite3_value_blob(*argv);
      iVar1 = sqlite3_value_bytes(*argv);
      pcVar3 = (char *)contextMalloc(context,(long)iVar1 * 2 + 4);
      if (pcVar3 != (char *)0x0) {
        for (j = 0; j < iVar1; j = j + 1) {
          pcVar3[j * 2 + 2] =
               "0123456789ABCDEF"[(int)((int)*(char *)((long)pvVar2 + (long)j) >> 4 & 0xf)];
          pcVar3[j * 2 + 3] =
               "0123456789ABCDEF"[(int)((int)*(char *)((long)pvVar2 + (long)j) & 0xf)];
        }
        pcVar3[iVar1 * 2 + 2] = '\'';
        pcVar3[iVar1 * 2 + 3] = '\0';
        *pcVar3 = 'X';
        pcVar3[1] = '\'';
        sqlite3_result_text(context,pcVar3,-1,(_func_void_void_ptr *)0xffffffffffffffff);
        sqlite3_free(pcVar3);
      }
      break;
    case 0x1ea51f:
      puVar4 = sqlite3_value_text(*argv);
      if (puVar4 != (uchar *)0x0) {
        zArg = (uchar *)0x0;
        for (n._4_4_ = 0; puVar4[n._4_4_] != '\0'; n._4_4_ = n._4_4_ + 1) {
          if (puVar4[n._4_4_] == '\'') {
            zArg = zArg + 1;
          }
        }
        pcVar3 = (char *)contextMalloc(context,(i64)(zArg + (long)n._4_4_ + 3));
        if (pcVar3 != (char *)0x0) {
          *pcVar3 = '\'';
          n._0_4_ = 1;
          for (n._4_4_ = 0; puVar4[n._4_4_] != '\0'; n._4_4_ = n._4_4_ + 1) {
            pcVar3[(int)n] = puVar4[n._4_4_];
            iVar1 = (int)n + 1;
            if (puVar4[n._4_4_] == '\'') {
              pcVar3[(int)n + 1] = '\'';
              iVar1 = (int)n + 2;
            }
            n._0_4_ = iVar1;
          }
          pcVar3[(int)n] = '\'';
          pcVar3[(int)n + 1] = '\0';
          sqlite3_result_text(context,pcVar3,(int)n + 1,sqlite3_free);
        }
      }
    }
  }
  else {
    sqlite3_result_text(context,"NULL",4,(_func_void_void_ptr *)0x0);
  }
  return;
}

Assistant:

static void quoteFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_FLOAT: {
      double r1, r2;
      char zBuf[50];
      r1 = sqlite3_value_double(argv[0]);
      sqlite3_snprintf(sizeof(zBuf), zBuf, "%!.15g", r1);
      sqlite3AtoF(zBuf, &r2, 20, SQLITE_UTF8);
      if( r1!=r2 ){
        sqlite3_snprintf(sizeof(zBuf), zBuf, "%!.20e", r1);
      }
      sqlite3_result_text(context, zBuf, -1, SQLITE_TRANSIENT);
      break;
    }
    case SQLITE_INTEGER: {
      sqlite3_result_value(context, argv[0]);
      break;
    }
    case SQLITE_BLOB: {
      char *zText = 0;
      char const *zBlob = sqlite3_value_blob(argv[0]);
      int nBlob = sqlite3_value_bytes(argv[0]);
      assert( zBlob==sqlite3_value_blob(argv[0]) ); /* No encoding change */
      zText = (char *)contextMalloc(context, (2*(i64)nBlob)+4); 
      if( zText ){
        int i;
        for(i=0; i<nBlob; i++){
          zText[(i*2)+2] = hexdigits[(zBlob[i]>>4)&0x0F];
          zText[(i*2)+3] = hexdigits[(zBlob[i])&0x0F];
        }
        zText[(nBlob*2)+2] = '\'';
        zText[(nBlob*2)+3] = '\0';
        zText[0] = 'X';
        zText[1] = '\'';
        sqlite3_result_text(context, zText, -1, SQLITE_TRANSIENT);
        sqlite3_free(zText);
      }
      break;
    }
    case SQLITE_TEXT: {
      int i,j;
      u64 n;
      const unsigned char *zArg = sqlite3_value_text(argv[0]);
      char *z;

      if( zArg==0 ) return;
      for(i=0, n=0; zArg[i]; i++){ if( zArg[i]=='\'' ) n++; }
      z = contextMalloc(context, ((i64)i)+((i64)n)+3);
      if( z ){
        z[0] = '\'';
        for(i=0, j=1; zArg[i]; i++){
          z[j++] = zArg[i];
          if( zArg[i]=='\'' ){
            z[j++] = '\'';
          }
        }
        z[j++] = '\'';
        z[j] = 0;
        sqlite3_result_text(context, z, j, sqlite3_free);
      }
      break;
    }
    default: {
      assert( sqlite3_value_type(argv[0])==SQLITE_NULL );
      sqlite3_result_text(context, "NULL", 4, SQLITE_STATIC);
      break;
    }
  }
}